

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

ON_FontFaceQuartet * __thiscall
ON_ClassArray<ON_FontFaceQuartet>::SetCapacity
          (ON_ClassArray<ON_FontFaceQuartet> *this,size_t new_capacity)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ON_FontFaceQuartet *pOVar3;
  
  uVar6 = this->m_capacity;
  uVar7 = (ulong)uVar6;
  if (uVar7 == 0) {
    this->m_a = (ON_FontFaceQuartet *)0x0;
    this->m_count = 0;
  }
  uVar5 = (uint)new_capacity;
  if (0x7ffffffe < new_capacity - 1 >> 1) {
    uVar5 = 0;
  }
  if ((int)uVar5 < 1) {
    if (this->m_a != (ON_FontFaceQuartet *)0x0) {
      if (0 < (int)uVar6) {
        lVar8 = uVar7 + 1;
        lVar4 = uVar7 * 0x28;
        do {
          ON_wString::~ON_wString((ON_wString *)((long)&this->m_a[-1].m_quartet_name.m_s + lVar4));
          lVar8 = lVar8 + -1;
          lVar4 = lVar4 + -0x28;
        } while (1 < lVar8);
      }
      (*this->_vptr_ON_ClassArray[4])(this,this->m_a,0);
      this->m_a = (ON_FontFaceQuartet *)0x0;
    }
  }
  else if ((int)uVar6 < (int)uVar5) {
    iVar2 = (*this->_vptr_ON_ClassArray[4])(this,this->m_a,(ulong)uVar5);
    pOVar3 = (ON_FontFaceQuartet *)CONCAT44(extraout_var,iVar2);
    this->m_a = pOVar3;
    if (pOVar3 != (ON_FontFaceQuartet *)0x0) {
      memset(pOVar3 + this->m_capacity,0,((long)(int)uVar5 - (long)this->m_capacity) * 0x28);
      iVar2 = this->m_capacity;
      if (iVar2 < (int)uVar5) {
        lVar4 = (long)iVar2 * 0x28;
        lVar8 = (ulong)uVar5 - (long)iVar2;
        do {
          pOVar3 = this->m_a;
          ON_wString::ON_wString((ON_wString *)((long)&(pOVar3->m_quartet_name).m_s + lVar4));
          puVar1 = (undefined8 *)((long)&pOVar3->m_italic + lVar4);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)&pOVar3->m_regular + lVar4);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar4 = lVar4 + 0x28;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      this->m_capacity = uVar5;
      goto LAB_00490b28;
    }
  }
  else {
    if ((int)uVar6 <= (int)uVar5) goto LAB_00490b28;
    do {
      uVar6 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar6;
      ON_wString::~ON_wString(&this->m_a[uVar7].m_quartet_name);
    } while ((int)uVar5 < (int)uVar6);
    if ((int)uVar5 < this->m_count) {
      this->m_count = uVar5;
    }
    this->m_capacity = uVar5;
    iVar2 = (*this->_vptr_ON_ClassArray[4])(this,this->m_a,(ulong)uVar5);
    this->m_a = (ON_FontFaceQuartet *)CONCAT44(extraout_var_00,iVar2);
    if ((ON_FontFaceQuartet *)CONCAT44(extraout_var_00,iVar2) != (ON_FontFaceQuartet *)0x0)
    goto LAB_00490b28;
  }
  this->m_count = 0;
  this->m_capacity = 0;
LAB_00490b28:
  return this->m_a;
}

Assistant:

T* ON_ClassArray<T>::SetCapacity( size_t new_capacity ) 
{
  if (0 == m_capacity)
  {
    // Allow "expert" users of ON_SimpleArray<>.SetArray(*,*,0) to clean up after themselves
    // and deals with the case when the forget to clean up after themselves.
    m_a = nullptr;
    m_count = 0;
  }
  // uses "placement" for class construction/destruction
  int i;
  int capacity = (new_capacity > 0 && new_capacity < ON_UNSET_UINT_INDEX)
               ? (int)new_capacity 
               : 0;

  if ( capacity <= 0 ) {
    if ( m_a ) {
      for ( i = m_capacity-1; i >= 0; i-- ) {
        DestroyElement(m_a[i]);
      }
      Realloc(m_a,0);
      m_a = 0;
    }
    m_count = 0;
    m_capacity = 0;
  }
  else if ( m_capacity < capacity ) {
    // growing
    m_a = Realloc( m_a, capacity );
    // initialize new elements with default constructor
    if ( 0 != m_a )
    {
      // even when m_a is an array of classes with vtable pointers,
      // this call to memset(..., 0, ...) is what I want to do
      // because in-place construction will be used when needed
      // on this memory.
      memset( (void*)(m_a + m_capacity), 0, (capacity-m_capacity)*sizeof(T) );
      for ( i = m_capacity; i < capacity; i++ ) {
        ConstructDefaultElement(&m_a[i]);
      }
      m_capacity = capacity;
    }
    else
    {
      // memory allocation failed
      m_capacity = 0;
      m_count = 0;
    }
  }
  else if ( m_capacity > capacity ) {
    // shrinking
    for ( i = m_capacity-1; i >= capacity; i-- ) {
      DestroyElement(m_a[i]);
    }
    if ( m_count > capacity )
      m_count = capacity;
    m_capacity = capacity;
    m_a = Realloc( m_a, capacity );
    if ( 0 == m_a )
    {
      // memory allocation failed
      m_capacity = 0;
      m_count = 0;
    }
  }
  return m_a;
}